

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::DOMNodeImpl::lookupNamespaceURI(DOMNodeImpl *this,XMLCh *specifiedPrefix)

{
  DOMNodeImpl *currentNode;
  bool bVar1;
  int iVar2;
  DOMNode *pDVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLCh *str1;
  DOMNodeImpl *pDVar4;
  long lVar5;
  DOMNodeImpl *pDVar6;
  DOMNodeImpl *str1_00;
  XMLCh *pXVar7;
  DOMNodeImpl *str1_01;
  DOMNodeImpl *pDVar8;
  undefined4 extraout_var_03;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar9;
  XMLSize_t i;
  long lVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  currentNode = (DOMNodeImpl *)this->fContainingNode;
  pDVar8 = currentNode;
  iVar2 = (*(code *)currentNode->fContainingNode[4]._vptr_DOMNode)();
  switch((short)iVar2) {
  case 1:
    iVar2 = (*(code *)currentNode->fContainingNode[0x16]._vptr_DOMNode)(currentNode);
    pXVar7 = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
    iVar2 = (*(code *)currentNode->fContainingNode[0x17]._vptr_DOMNode)(currentNode);
    str1 = (XMLCh *)CONCAT44(extraout_var_01,iVar2);
    if (pXVar7 != (XMLCh *)0x0) {
      if (specifiedPrefix == (XMLCh *)0x0 && str1 == (XMLCh *)0x0) {
        return pXVar7;
      }
      if ((str1 != (XMLCh *)0x0) && (bVar1 = XMLString::equals(str1,specifiedPrefix), bVar1)) {
        return pXVar7;
      }
    }
    pDVar8 = currentNode;
    iVar2 = (*(code *)currentNode->fContainingNode[0x1a]._vptr_DOMNode)();
    if ((char)iVar2 != '\0') {
      pDVar8 = currentNode;
      iVar2 = (*(code *)currentNode->fContainingNode[0xb]._vptr_DOMNode)();
      pDVar4 = (DOMNodeImpl *)CONCAT44(extraout_var_02,iVar2);
      if (pDVar4 != (DOMNodeImpl *)0x0) {
        pDVar8 = pDVar4;
        lVar5 = (*(code *)pDVar4->fContainingNode[5]._vptr_DOMNode)();
        for (lVar10 = 0; lVar5 != lVar10; lVar10 = lVar10 + 1) {
          pDVar6 = (DOMNodeImpl *)(*(code *)pDVar4->fContainingNode[3]._vptr_DOMNode)(pDVar4,lVar10)
          ;
          str1_00 = (DOMNodeImpl *)(*(code *)pDVar6->fContainingNode[0x17]._vptr_DOMNode)(pDVar6);
          pXVar7 = (XMLCh *)(*(code *)pDVar6->fContainingNode[3]._vptr_DOMNode)(pDVar6);
          pDVar8 = pDVar6;
          str1_01 = (DOMNodeImpl *)(*(code *)pDVar6->fContainingNode[0x16]._vptr_DOMNode)();
          if ((str1_01 != (DOMNodeImpl *)0x0) &&
             (bVar1 = XMLString::equals((XMLCh *)str1_01,(XMLCh *)XMLUni::fgXMLNSURIName),
             pDVar8 = str1_01, bVar1)) {
            if (specifiedPrefix == (XMLCh *)0x0) {
              str1_01 = (DOMNodeImpl *)(*(code *)pDVar6->fContainingNode[2]._vptr_DOMNode)(pDVar6);
              bVar1 = XMLString::equals((XMLCh *)str1_01,(XMLCh *)XMLUni::fgXMLNSString);
              if (bVar1) {
                return pXVar7;
              }
            }
            pDVar8 = str1_01;
            if ((str1_00 != (DOMNodeImpl *)0x0) &&
               (bVar1 = XMLString::equals((XMLCh *)str1_00,(XMLCh *)XMLUni::fgXMLNSString),
               pDVar8 = str1_00, bVar1)) {
              pDVar8 = (DOMNodeImpl *)(*(code *)pDVar6->fContainingNode[0x18]._vptr_DOMNode)(pDVar6)
              ;
              bVar1 = XMLString::equals((XMLCh *)pDVar8,specifiedPrefix);
              if (bVar1) {
                return pXVar7;
              }
            }
          }
        }
      }
    }
    pDVar3 = getElementAncestor(pDVar8,(DOMNode *)currentNode);
    uVar9 = extraout_RDX_02;
    break;
  case 2:
    iVar2 = (*this->fOwnerNode->_vptr_DOMNode[4])();
    if (iVar2 != 1) {
      return (XMLCh *)0x0;
    }
    pDVar3 = this->fOwnerNode;
    uVar9 = extraout_RDX_00;
    goto LAB_00281df0;
  default:
    pDVar3 = getElementAncestor(pDVar8,this->fContainingNode);
    uVar9 = extraout_RDX;
    break;
  case 6:
  case 10:
  case 0xb:
  case 0xc:
    goto LAB_00281c41;
  case 9:
    iVar2 = (*(code *)currentNode[-1].fContainingNode[0xd]._vptr_DOMNode)(currentNode + -1);
    pDVar3 = (DOMNode *)CONCAT44(extraout_var,iVar2);
    uVar9 = extraout_RDX_01;
    goto LAB_00281df0;
  }
  if (pDVar3 == (DOMNode *)0x0) {
LAB_00281c41:
    return (XMLCh *)0x0;
  }
LAB_00281df0:
  iVar2 = (*pDVar3->_vptr_DOMNode[0x25])(pDVar3,specifiedPrefix,uVar9,pDVar3->_vptr_DOMNode[0x25]);
  return (XMLCh *)CONCAT44(extraout_var_03,iVar2);
}

Assistant:

const XMLCh* DOMNodeImpl::lookupNamespaceURI(const XMLCh* specifiedPrefix) const  {
    const DOMNode *thisNode = getContainingNode();

    short type = thisNode->getNodeType();
    switch (type) {
    case DOMNode::ELEMENT_NODE : {
        const XMLCh* ns = thisNode->getNamespaceURI();
        const XMLCh* prefix = thisNode->getPrefix();
        if (ns != 0) {
            // REVISIT: is it possible that prefix is empty string?
            if (specifiedPrefix == 0 && prefix == specifiedPrefix) {
                // looking for default namespace
                return ns;
            } else if (prefix != 0 && XMLString::equals(prefix, specifiedPrefix)) {
                // non default namespace
                return ns;
            }
        }
        if (thisNode->hasAttributes()) {
            DOMNamedNodeMap *nodeMap = thisNode->getAttributes();
            if(nodeMap != 0) {
                XMLSize_t length = nodeMap->getLength();
                for (XMLSize_t i = 0;i < length;i++) {
                    DOMNode *attr = nodeMap->item(i);
                    const XMLCh *attrPrefix = attr->getPrefix();
                    const XMLCh *value = attr->getNodeValue();
                    ns = attr->getNamespaceURI();

                    if (ns != 0 && XMLString::equals(ns, XMLUni::fgXMLNSURIName)) {
                        // at this point we are dealing with DOM Level 2 nodes only
                        if (specifiedPrefix == 0 &&
                            XMLString::equals(attr->getNodeName(), XMLUni::fgXMLNSString)) {
                            // default namespace
                            return value;
                        } else if (attrPrefix != 0 &&
                                   XMLString::equals(attrPrefix, XMLUni::fgXMLNSString) &&
                                   XMLString::equals(attr->getLocalName(), specifiedPrefix)) {
                            // non default namespace
                            return value;
                        }
                    }
                }
            }
        }
        DOMNode *ancestor = getElementAncestor(thisNode);
        if (ancestor != 0) {
            return ancestor->lookupNamespaceURI(specifiedPrefix);
        }
        return 0;
    }
    case DOMNode::DOCUMENT_NODE : {
        return((DOMDocument*)thisNode)->getDocumentElement()->lookupNamespaceURI(specifiedPrefix);
    }
    case DOMNode::ENTITY_NODE :
    case DOMNode::NOTATION_NODE:
    case DOMNode::DOCUMENT_FRAGMENT_NODE:
    case DOMNode::DOCUMENT_TYPE_NODE:
        // type is unknown
        return 0;
    case DOMNode::ATTRIBUTE_NODE:{
        if (fOwnerNode->getNodeType() == DOMNode::ELEMENT_NODE) {
            return fOwnerNode->lookupNamespaceURI(specifiedPrefix);
        }
        return 0;
    }
    default:{
        DOMNode *ancestor = getElementAncestor(getContainingNode());
        if (ancestor != 0) {
            return ancestor->lookupNamespaceURI(specifiedPrefix);
        }
        return 0;
    }
    }
}